

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall
lodepng::ExtractZlib::generateFixedTrees(ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD)

{
  reference pvVar1;
  size_t i_1;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlenD;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlen;
  unsigned_long in_stack_000000b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000000c0;
  HuffmanTree *in_stack_000000c8;
  allocator_type *in_stack_ffffffffffffff78;
  ulong __n;
  value_type_conflict2 *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30 [2];
  
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x148c87);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x148cac);
  pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x5;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x148cc3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (pvVar2,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x148ce7);
  for (pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x90;
      pvVar2 < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x100;
      pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_30,(size_type)pvVar2);
    *pvVar1 = 9;
  }
  for (__n = 0x100; __n < 0x118; __n = __n + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_30,__n);
    *pvVar1 = 7;
  }
  HuffmanTree::makeFromLengths(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  HuffmanTree::makeFromLengths(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar2);
  return;
}

Assistant:

void generateFixedTrees(HuffmanTree& tree, HuffmanTree& treeD) { //get the tree of a deflated block with fixed tree
    std::vector<unsigned long> bitlen(288, 8), bitlenD(32, 5);;
    for(size_t i = 144; i <= 255; i++) bitlen[i] = 9;
    for(size_t i = 256; i <= 279; i++) bitlen[i] = 7;
    tree.makeFromLengths(bitlen, 15);
    treeD.makeFromLengths(bitlenD, 15);
  }